

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O1

float Abc_NtkComputeEdgeDept(Abc_Obj_t *pFanout,int iFanin,float Slew)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  SC_Timing *pTime;
  long lVar8;
  SC_Cell *pCell;
  SC_Pair SlewOut;
  SC_Pair SlewIn;
  SC_Pair ArrOut;
  SC_Pair ArrIn;
  SC_Pair LoadIn;
  SC_Pair local_50;
  SC_Pair local_48;
  SC_Pair local_40;
  SC_Pair local_38;
  SC_Pair local_30;
  
  iVar2 = pFanout->Id;
  lVar8 = (long)iVar2;
  if (-1 < lVar8) {
    pAVar4 = pFanout->pNtk;
    lVar5 = *(long *)((long)pAVar4->pBSMan + 0x48);
    if ((iVar2 < *(int *)(lVar5 + 4)) &&
       (lVar6 = *(long *)((long)pAVar4->pBSMan + 0x50), iVar2 < *(int *)(lVar6 + 4))) {
      if (pAVar4->vGates->nSize <= iVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      local_30.rise = *(float *)(*(long *)(lVar5 + 8) + lVar8 * 4);
      fVar1 = *(float *)(*(long *)(lVar6 + 8) + lVar8 * 4);
      uVar3 = pAVar4->vGates->pArray[lVar8];
      if ((ulong)uVar3 == 0xffffffff) {
        pCell = (SC_Cell *)0x0;
      }
      else {
        if (((int)uVar3 < 0) || (*(int *)((long)pAVar4->pSCLib + 100) <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pCell = *(SC_Cell **)(*(long *)((long)pAVar4->pSCLib + 0x68) + (ulong)uVar3 * 8);
      }
      local_38.rise = 0.0;
      local_38.fall = 0.0;
      local_40.rise = 0.0;
      local_40.fall = 0.0;
      local_50.rise = 0.0;
      local_50.fall = 0.0;
      local_48.fall = Slew;
      local_48.rise = Slew;
      local_30.fall = local_30.rise;
      pTime = Scl_CellPinTime(pCell,iFanin);
      Scl_LibPinArrival(pTime,&local_38,&local_48,&local_30,&local_40,&local_50);
      fVar7 = local_40.fall * 0.5 + local_40.rise * 0.5;
      if (0.0 < fVar7) {
        return fVar1 + fVar7;
      }
      __assert_fail("Edge > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBufSize.c"
                    ,0xaf,"float Abc_NtkComputeEdgeDept(Abc_Obj_t *, int, float)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
}

Assistant:

static inline float Abc_NtkComputeEdgeDept( Abc_Obj_t * pFanout, int iFanin, float Slew )
{
    float Load = Bus_SclObjLoad( pFanout );
    float Dept = Bus_SclObjDept( pFanout );
    float Edge = Scl_LibPinArrivalEstimate( Abc_SclObjCell(pFanout), iFanin, Slew, Load );
    assert( Edge > 0 );
    return Dept + Edge;
}